

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O0

taylor<double,_1,_2> *
operator*(taylor<double,_1,_2> *__return_storage_ptr__,int *x,taylor<double,_1,_2> *t)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  undefined4 local_1c;
  int i;
  taylor<double,_1,_2> *t_local;
  int *x_local;
  
  taylor<double,_1,_2>::taylor(__return_storage_ptr__);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    iVar2 = *x;
    pdVar3 = taylor<double,_1,_2>::operator[](t,local_1c);
    dVar1 = *pdVar3;
    pdVar3 = taylor<double,_1,_2>::operator[](__return_storage_ptr__,local_1c);
    *pdVar3 = (double)iVar2 * dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator*(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
  taylor<T, Nvar, Ndeg> tmp;
  for (int i = 0; i < tmp.size; i++)
    tmp[i] = x * t[i];
  return tmp;
}